

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O1

bool __thiscall Vehicle::owner(Vehicle *this,unique_ptr<Person,_std::default_delete<Person>_> *o)

{
  Person *pPVar1;
  Person *__ptr;
  
  pPVar1 = (o->_M_t).super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
           super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
           super__Head_base<0UL,_Person_*,_false>._M_head_impl;
  (o->_M_t).super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
  super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
  super__Head_base<0UL,_Person_*,_false>._M_head_impl = (Person *)0x0;
  __ptr = (this->_owner)._M_t.super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
          super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
          super__Head_base<0UL,_Person_*,_false>._M_head_impl;
  (this->_owner)._M_t.super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
  super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
  super__Head_base<0UL,_Person_*,_false>._M_head_impl = pPVar1;
  if (__ptr != (Person *)0x0) {
    std::default_delete<Person>::operator()((default_delete<Person> *)&this->_owner,__ptr);
  }
  return (this->_owner)._M_t.super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
         super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
         super__Head_base<0UL,_Person_*,_false>._M_head_impl != (Person *)0x0;
}

Assistant:

bool owner(std::unique_ptr<Person> o) { _owner = std::move(o); return !!_owner; }